

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall helics::CoreBroker::processLocalQuery(CoreBroker *this,ActionMessage *message)

{
  int iVar1;
  bool bVar2;
  mapped_type *pmVar3;
  action_t startingAction;
  string_view request;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  allocator<char> local_111;
  string local_110;
  ActionMessage queryRep;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  if (message->messageAction == cmd_query_ordered) {
    bVar2 = true;
    startingAction = cmd_query_reply_ordered;
  }
  else {
    bVar2 = message->messageAction == cmd_broker_query_ordered;
    startingAction = cmd_query_reply;
    if (bVar2) {
      startingAction = cmd_query_reply_ordered;
    }
  }
  ActionMessage::ActionMessage(&queryRep,startingAction);
  queryRep.source_id.gid = (this->super_BrokerBase).global_broker_id_local.gid;
  queryRep.dest_id.gid = (message->source_id).gid;
  queryRep.messageID = message->messageID;
  request._M_str = (char *)(message->payload).heap;
  request._M_len = (message->payload).bufferSize;
  generateQueryAnswer_abi_cxx11_(&local_110,this,request,bVar2);
  SmallBuffer::operator=
            (&queryRep.payload,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  queryRep.counter = message->counter;
  __y._M_str = "#wait";
  __y._M_len = 5;
  __x._M_str = (char *)queryRep.payload.heap;
  __x._M_len = queryRep.payload.bufferSize;
  bVar2 = std::operator==(__x,__y);
  iVar1 = (this->super_BrokerBase).global_broker_id_local.gid;
  if (bVar2) {
    if (queryRep.dest_id.gid == iVar1) {
      if ((this->queryTimeouts).
          super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (this->queryTimeouts).
          super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        BrokerBase::setTickForwarding(&this->super_BrokerBase,QUERY_TIMEOUT,true);
      }
      local_110._M_dataplus._M_p = (pointer)std::chrono::_V2::steady_clock::now();
      std::
      deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
      ::
      emplace_back<int&,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
                ((deque<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>,std::allocator<std::pair<int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
                  *)&this->queryTimeouts,&queryRep.messageID,
                 (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  *)&local_110);
    }
    local_110._M_dataplus._M_p = (pointer)(message->payload).bufferSize;
    local_110._M_string_length = (size_type)(message->payload).heap;
    pmVar3 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
             ::at((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_short,_helics::QueryReuse>_>_>_>
                   *)mapIndex,(key_type *)&local_110);
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              (&(this->mapBuilders).
                super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
                ._M_impl.super__Vector_impl_data._M_start[pmVar3->first].
                super__Tuple_impl<0UL,_helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                .
                super__Tuple_impl<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>
                .
                super__Head_base<1UL,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_false>
                ._M_head_impl,&queryRep);
  }
  else if (queryRep.dest_id.gid == iVar1) {
    iVar1 = message->messageID;
    local_38._M_len = queryRep.payload.bufferSize;
    local_38._M_str = (char *)queryRep.payload.heap;
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_110,&local_38,&local_111);
    gmlc::concurrency::
    DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::setDelayedValue(&this->activeQueries,iVar1,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_110);
    std::__cxx11::string::~string((string *)&local_110);
  }
  else {
    routeMessage(this,&queryRep,(GlobalFederateId)(message->source_id).gid);
  }
  ActionMessage::~ActionMessage(&queryRep);
  return;
}

Assistant:

void CoreBroker::processLocalQuery(const ActionMessage& message)
{
    const bool force_ordered =
        (message.action() == CMD_QUERY_ORDERED || message.action() == CMD_BROKER_QUERY_ORDERED);
    ActionMessage queryRep(force_ordered ? CMD_QUERY_REPLY_ORDERED : CMD_QUERY_REPLY);
    queryRep.source_id = global_broker_id_local;
    queryRep.dest_id = message.source_id;
    queryRep.messageID = message.messageID;
    queryRep.payload = generateQueryAnswer(message.payload.to_string(), force_ordered);
    queryRep.counter = message.counter;
    if (queryRep.payload.to_string() == "#wait") {
        if (queryRep.dest_id == global_broker_id_local) {
            if (queryTimeouts.empty()) {
                setTickForwarding(TickForwardingReasons::QUERY_TIMEOUT, true);
            }
            queryTimeouts.emplace_back(queryRep.messageID, std::chrono::steady_clock::now());
        }
        std::get<1>(mapBuilders[mapIndex.at(message.payload.to_string()).first])
            .push_back(queryRep);
    } else if (queryRep.dest_id == global_broker_id_local) {
        activeQueries.setDelayedValue(message.messageID, std::string(queryRep.payload.to_string()));
    } else {
        routeMessage(std::move(queryRep), message.source_id);
    }
}